

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::DOMNodeImpl::isDefaultNamespace(DOMNodeImpl *this,XMLCh *namespaceURI)

{
  XMLCh XVar1;
  XMLCh XVar2;
  DOMNodeImpl *currentNode;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  XMLCh *pXVar6;
  DOMNode *pDVar7;
  undefined4 extraout_var_02;
  DOMNodeImpl *this_00;
  undefined4 extraout_var_01;
  
  currentNode = (DOMNodeImpl *)this->fContainingNode;
  this_00 = currentNode;
  iVar4 = (*(code *)currentNode->fContainingNode[4]._vptr_DOMNode)();
  switch((short)iVar4) {
  case 1:
    iVar4 = (*(code *)currentNode->fContainingNode[0x17]._vptr_DOMNode)(currentNode);
    if (((short *)CONCAT44(extraout_var_00,iVar4) == (short *)0x0) ||
       (*(short *)CONCAT44(extraout_var_00,iVar4) == 0)) {
      iVar4 = (*(code *)currentNode->fContainingNode[0x16]._vptr_DOMNode)(currentNode);
      pXVar6 = (XMLCh *)CONCAT44(extraout_var_02,iVar4);
      if (pXVar6 == namespaceURI) {
        return true;
      }
      if (pXVar6 == (XMLCh *)0x0 || namespaceURI == (XMLCh *)0x0) {
        if (namespaceURI == (XMLCh *)0x0) {
          if (pXVar6 == (XMLCh *)0x0) {
            return true;
          }
        }
        else if (*namespaceURI != L'\0' || pXVar6 == (XMLCh *)0x0) {
          return *namespaceURI == L'\0';
        }
      }
      else {
        while (XVar1 = *namespaceURI, XVar1 != L'\0') {
          namespaceURI = namespaceURI + 1;
          XVar2 = *pXVar6;
          pXVar6 = pXVar6 + 1;
          if (XVar1 != XVar2) {
            return false;
          }
        }
      }
      return *pXVar6 == L'\0';
    }
    this_00 = currentNode;
    iVar4 = (*(code *)currentNode->fContainingNode[0x1a]._vptr_DOMNode)();
    if ((char)iVar4 != '\0') {
      this_00 = currentNode;
      iVar4 = (*(code *)currentNode->fContainingNode[0x33]._vptr_DOMNode)
                        (currentNode,&XMLUni::fgXMLNSURIName,&XMLUni::fgXMLNSString);
      plVar5 = (long *)CONCAT44(extraout_var_01,iVar4);
      if (plVar5 != (long *)0x0) {
        pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0x18))(plVar5);
        bVar3 = XMLString::equals(namespaceURI,pXVar6);
        return bVar3;
      }
    }
  default:
    pDVar7 = getElementAncestor(this_00,(DOMNode *)currentNode);
    if (pDVar7 != (DOMNode *)0x0) {
LAB_002733f0:
      iVar4 = (*pDVar7->_vptr_DOMNode[0x24])(pDVar7,namespaceURI);
      return SUB41(iVar4,0);
    }
    break;
  case 2:
    iVar4 = (*this->fOwnerNode->_vptr_DOMNode[4])();
    if (iVar4 == 1) {
      iVar4 = (*this->fOwnerNode->_vptr_DOMNode[0x24])(this->fOwnerNode,namespaceURI);
      return SUB41(iVar4,0);
    }
    break;
  case 6:
  case 10:
  case 0xb:
  case 0xc:
    break;
  case 9:
    iVar4 = (*(code *)currentNode[-1].fContainingNode[0xd]._vptr_DOMNode)(currentNode + -1);
    pDVar7 = (DOMNode *)CONCAT44(extraout_var,iVar4);
    goto LAB_002733f0;
  }
  return false;
}

Assistant:

bool DOMNodeImpl::isDefaultNamespace(const XMLCh* namespaceURI) const {
	const DOMNode *thisNode = getContainingNode();
    short type = thisNode->getNodeType();
    switch (type) {
    case DOMNode::ELEMENT_NODE: {
        const XMLCh *prefix = thisNode->getPrefix();

        // REVISIT: is it possible that prefix is empty string?
        if (prefix == 0 || !*prefix) {
            return XMLString::equals(namespaceURI, thisNode->getNamespaceURI());
        }

        if (thisNode->hasAttributes()) {
            DOMElement *elem = (DOMElement *)thisNode;
            DOMNode *attr = elem->getAttributeNodeNS(XMLUni::fgXMLNSURIName, XMLUni::fgXMLNSString);
            if (attr != 0) {
                const XMLCh *value = attr->getNodeValue();
                return XMLString::equals(namespaceURI, value);
            }
        }
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->isDefaultNamespace(namespaceURI);
        }

        return false;
    }
    case DOMNode::DOCUMENT_NODE:{
        return ((DOMDocument*)thisNode)->getDocumentElement()->isDefaultNamespace(namespaceURI);
    }

    case DOMNode::ENTITY_NODE :
    case DOMNode::NOTATION_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
        // type is unknown
        return false;
    case DOMNode::ATTRIBUTE_NODE:{
        if (fOwnerNode->getNodeType() == DOMNode::ELEMENT_NODE) {
            return fOwnerNode->isDefaultNamespace(namespaceURI);

        }
        return false;
    }
    default:{
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->isDefaultNamespace(namespaceURI);
        }
        return false;
    }

    }
}